

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempdir.cpp
# Opt level: O3

string * fs_get_tempdir_abi_cxx11_(void)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string_view fname;
  string_view name;
  string_view path;
  string t;
  path p;
  error_code ec;
  string local_68;
  path local_48;
  error_code local_20;
  
  local_20._M_value = 0;
  local_20._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::temp_directory_path_abi_cxx11_((error_code *)&local_48);
  if ((local_20._M_value == 0) && (local_48._M_pathname._M_string_length != 0)) {
    std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
              (in_RDI,&local_48,(allocator<char> *)&local_68);
  }
  else {
    name._M_str = "TMPDIR";
    name._M_len = 6;
    fs_getenv_abi_cxx11_(&local_68,name);
    if (local_68._M_string_length == 0) {
      bVar1 = fs_is_dir("/tmp");
      if (bVar1) {
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        std::__cxx11::string::_M_construct<char_const*>();
      }
      else {
        fname._M_str = "fs_get_tempdir";
        fname._M_len = 0xe;
        fs_print_error((string_view)(ZEXT816(0x1120b9) << 0x40),fname,&local_20);
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        in_RDI->_M_string_length = 0;
        (in_RDI->field_2)._M_local_buf[0] = '\0';
      }
    }
    else {
      path._M_str = local_68._M_dataplus._M_p;
      path._M_len = local_68._M_string_length;
      fs_as_posix_abi_cxx11_(in_RDI,path);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::~path(&local_48);
  return in_RDI;
}

Assistant:

std::string fs_get_tempdir()
{
  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  auto p = std::filesystem::temp_directory_path(ec);
  if(!ec && !p.empty()) FFS_LIKELY
    return p.generic_string();
#endif

#if defined(_WIN32)
  // GetTempPath2A is not in MSYS2
  std::string t(fs_get_max_path(), '\0');
  auto L = GetTempPathA(static_cast<DWORD>(t.size()), t.data());
  if (L > 0)  FFS_LIKELY
    t.resize(L);
#else
  std::string t(fs_getenv("TMPDIR"));
#endif

  if(!t.empty()) FFS_LIKELY
    return fs_as_posix(t);

  if (fs_is_dir("/tmp"))
    return "/tmp";

  fs_print_error("", __func__, ec);
  return {};
}